

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

void cfl_pick_plane_rd(AV1_COMP *cpi,MACROBLOCK *x,int plane,TX_SIZE tx_size,int cfl_search_range,
                      RD_STATS *cfl_rd_arr,int est_best_cfl_idx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int in_EDX;
  long in_RSI;
  MACROBLOCK *in_RDI;
  int in_R8D;
  long in_R9;
  AV1_COMP *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int cfl_idx_1;
  int i;
  int dir;
  int si;
  int start_cfl_idx;
  int fast_mode;
  int cfl_idx;
  BLOCK_SIZE plane_bsize;
  MACROBLOCKD_PLANE *pd;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int local_5c;
  int local_54;
  int local_48;
  
  lVar3 = in_RSI + 0x1b0 + (long)in_EDX * 0xa30;
  get_plane_block_size
            (*(BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x2058),*(int *)(lVar3 + 4),
             *(int *)(lVar3 + 8));
  for (local_48 = 0; local_48 < 0x21; local_48 = local_48 + 1) {
    av1_invalid_rd_stats((RD_STATS *)(in_R9 + (long)local_48 * 0x28));
  }
  cfl_compute_rd(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(TX_SIZE)((ulong)in_RSI >> 0x18),
                 (BLOCK_SIZE)((ulong)in_RSI >> 0x10),in_EDX,in_stack_00000010,_cfl_idx_1);
  if (in_R8D != 1) {
    for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
      iVar1 = cfl_dir_ls[local_54];
      for (local_5c = 1;
          ((local_5c < in_R8D && (iVar2 = in_stack_00000008 + iVar1 * local_5c, -1 < iVar2)) &&
          (iVar2 < 0x21)); local_5c = local_5c + 1) {
        cfl_compute_rd(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),
                       (TX_SIZE)((ulong)in_RSI >> 0x18),(BLOCK_SIZE)((ulong)in_RSI >> 0x10),in_EDX,
                       in_stack_00000010,_cfl_idx_1);
      }
    }
  }
  return;
}

Assistant:

static void cfl_pick_plane_rd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              int plane, TX_SIZE tx_size, int cfl_search_range,
                              RD_STATS cfl_rd_arr[CFL_MAGS_SIZE],
                              int est_best_cfl_idx) {
  assert(cfl_search_range >= 1 && cfl_search_range <= CFL_MAGS_SIZE);
  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->uv_mode == UV_CFL_PRED);
  const MACROBLOCKD_PLANE *pd = &xd->plane[plane];
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);

  for (int cfl_idx = 0; cfl_idx < CFL_MAGS_SIZE; ++cfl_idx) {
    av1_invalid_rd_stats(&cfl_rd_arr[cfl_idx]);
  }

  int fast_mode = 0;
  int start_cfl_idx = est_best_cfl_idx;
  cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize, start_cfl_idx, fast_mode,
                 &cfl_rd_arr[start_cfl_idx]);

  if (cfl_search_range == 1) return;

  for (int si = 0; si < 2; ++si) {
    const int dir = cfl_dir_ls[si];
    for (int i = 1; i < cfl_search_range; ++i) {
      int cfl_idx = start_cfl_idx + dir * i;
      if (cfl_idx < 0 || cfl_idx >= CFL_MAGS_SIZE) break;
      cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize, cfl_idx, fast_mode,
                     &cfl_rd_arr[cfl_idx]);
    }
  }
}